

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

optional<CPubKey> * __thiscall
Satisfier<XOnlyPubKey>::
CPubFromPKHBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (optional<CPubKey> *__return_storage_ptr__,Satisfier<XOnlyPubKey> *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  CKeyID key_id;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)last._M_current - (long)first._M_current != 0x14) {
    __assert_fail("last - first == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0xdd,
                  "std::optional<CPubKey> Satisfier<XOnlyPubKey>::CPubFromPKHBytes(I, I) const [Pk = XOnlyPubKey, I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  pubkey.vch[0] = 0xff;
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  key_id.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  if (last._M_current != first._M_current) {
    key_id.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_ =
         *(undefined4 *)(first._M_current + 0x10);
    key_id.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ =
         *(undefined8 *)first._M_current;
    key_id.super_uint160.super_base_blob<160U>.m_data._M_elems._8_8_ =
         *(undefined8 *)(first._M_current + 8);
  }
  bVar2 = GetPubKey(this->m_provider,this->m_sig_data,&key_id,&pubkey);
  if (!bVar2) {
    std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
              (&this->m_sig_data->missing_pubkeys,&key_id);
  }
  else {
    memcpy(__return_storage_ptr__,&pubkey,0x41);
  }
  (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
  super__Optional_payload_base<CPubKey>._M_engaged = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CPubKey> CPubFromPKHBytes(I first, I last) const {
        assert(last - first == 20);
        CPubKey pubkey;
        CKeyID key_id;
        std::copy(first, last, key_id.begin());
        if (GetPubKey(m_provider, m_sig_data, key_id, pubkey)) return pubkey;
        m_sig_data.missing_pubkeys.push_back(key_id);
        return {};
    }